

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_types.h
# Opt level: O1

RuleBuilder * __thiscall Potassco::RuleBuilder::start(RuleBuilder *this,Head_t ht)

{
  uint *puVar1;
  
  puVar1 = (uint *)(this->mem_).beg_;
  if ((int)*puVar1 < 0) {
    puVar1[1] = 0;
    puVar1[2] = 0;
    puVar1[3] = 0;
    puVar1[4] = 0;
    *puVar1 = 0x14;
  }
  if (((puVar1[1] & 0x3fffffff) != 0) && (puVar1[2] != (puVar1[1] & 0x3fffffff))) {
    fail(-1,"RuleBuilder &Potassco::RuleBuilder::start(Head_t)",0x71,"!h.mbeg || h.len() == 0u",
         "Invalid second call to start()",0,puVar1);
  }
  puVar1[2] = *puVar1 & 0x7fffffff;
  puVar1[1] = ht.val_ << 0x1e | *puVar1 & 0x3fffffff;
  return this;
}

Assistant:

void*       begin()    const { return beg_; }